

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DRAMAddr.cpp
# Opt level: O1

void * __thiscall DRAMAddr::to_virt(DRAMAddr *this)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  
  lVar2 = 0;
  uVar1 = 0;
  do {
    uVar3 = *(ulong *)((long)MemConfig.ADDR_MTX + lVar2) &
            (this->col << ((byte)MemConfig.COL_SHIFT & 0x3f) |
            this->row << ((byte)MemConfig.ROW_SHIFT & 0x3f) |
            this->bank << ((byte)MemConfig.BK_SHIFT & 0x3f));
    uVar4 = (uint)(uVar3 >> 0x20) ^ (uint)uVar3;
    uVar4 = uVar4 >> 0x10 ^ uVar4;
    uVar1 = (ulong)((POPCOUNT((byte)uVar4 ^ (byte)(uVar4 >> 8)) & 1U) != 0) + uVar1 * 2;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0xf0);
  return (void *)(uVar1 | base_msb);
}

Assistant:

void *DRAMAddr::to_virt() const {
  size_t res = 0;
  size_t l = this->linearize();
  for (unsigned long i : MemConfig.ADDR_MTX) {
    res <<= 1ULL;
    res |= (size_t) __builtin_parityl(l & i);
  }
  void *v_addr = (void *) (base_msb | res);
  return v_addr;
}